

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

ParseableFunctionInfo *
Js::ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(FunctionBody *functionBody)

{
  NestedArray *pNVar1;
  Recycler *pRVar2;
  ParseableFunctionInfo *this;
  ProxyEntryPointInfo *this_00;
  FunctionInfo *nestedFunc;
  undefined8 uVar3;
  Type TVar4;
  uint i;
  uint index;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._32_8_ = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
  pNVar1 = (functionBody->super_ParseableFunctionInfo).nestedArray.ptr;
  index = 0;
  TVar4 = 0;
  if (pNVar1 != (NestedArray *)0x0) {
    TVar4 = pNVar1->nestedCount;
  }
  local_60 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x6fe;
  pRVar2 = Memory::Recycler::TrackAllocInfo
                     (((Type)data._32_8_)->recycler,(TrackAllocData *)local_60);
  this = (ParseableFunctionInfo *)new<Memory::Recycler>(0xb8,pRVar2,0x6da320);
  ParseableFunctionInfo(this,&functionBody->super_ParseableFunctionInfo);
  local_60 = (undefined1  [8])&ProxyEntryPointInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x701;
  pRVar2 = Memory::Recycler::TrackAllocInfo
                     (*(Recycler **)(data._32_8_ + 0x1200),(TrackAllocData *)local_60);
  uVar3 = 0;
  this_00 = (ProxyEntryPointInfo *)new<Memory::Recycler>(0x18,pRVar2,0x37a1d4);
  ProxyEntryPointInfo::ProxyEntryPointInfo
            (this_00,*(JavascriptMethod *)(data._32_8_ + 0x88),(ThreadContext *)0x0);
  Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::WriteBarrierSet
            (&(this->super_FunctionProxy).m_defaultEntryPointInfo,this_00);
  for (; TVar4 != index; index = index + 1) {
    nestedFunc = GetNestedFunc(&functionBody->super_ParseableFunctionInfo,index);
    SetNestedFunc(this,nestedFunc,index,(uint32)uVar3);
  }
  return this;
}

Assistant:

ParseableFunctionInfo *
    ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(FunctionBody * functionBody)
    {
        ScriptContext * scriptContext = functionBody->GetScriptContext();
        uint nestedCount = functionBody->GetNestedCount();

        ParseableFunctionInfo * info = RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(),
            ParseableFunctionInfo,
            functionBody);

        // Create new entry point info
        info->m_defaultEntryPointInfo = RecyclerNew(scriptContext->GetRecycler(), ProxyEntryPointInfo, scriptContext->DeferredParsingThunk);

        // Initialize nested function array, update back pointers
        for (uint i = 0; i < nestedCount; i++)
        {
            FunctionInfo * nestedInfo = functionBody->GetNestedFunc(i);
            info->SetNestedFunc(nestedInfo, i, 0);
        }

        // Update function objects

        return info;
    }